

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnd.h
# Opt level: O0

unsigned_long_long rnd_internal_murmur3_avalanche64(unsigned_long_long h)

{
  ulong uVar1;
  unsigned_long_long h_local;
  
  uVar1 = (h >> 0x21 ^ h) * -0xae502812aa7333;
  uVar1 = (uVar1 >> 0x21 ^ uVar1) * -0x3b314601e57a13ad;
  return uVar1 >> 0x21 ^ uVar1;
}

Assistant:

static RND_U64 rnd_internal_murmur3_avalanche64( RND_U64 h )
    {
    h ^= h >> 33;
    h *= 0xff51afd7ed558ccd;
    h ^= h >> 33;
    h *= 0xc4ceb9fe1a85ec53;
    h ^= h >> 33;
    return h;
    }